

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualTo.hpp
# Opt level: O0

EqualTo<int> * __thiscall
ut11::Operands::EqualTo<int>::GetErrorMessage<unsigned_long>
          (EqualTo<int> *this,unsigned_long *actual)

{
  ostream *poVar1;
  unsigned_long *in_RDX;
  utility local_1f8 [32];
  utility local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream errorMessage;
  ostream local_198 [376];
  unsigned_long *local_20;
  unsigned_long *actual_local;
  EqualTo<int> *this_local;
  
  local_20 = in_RDX;
  actual_local = actual;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected ");
  utility::ToString<int>(local_1d8,(int *)*actual);
  poVar1 = std::operator<<(poVar1,(string *)local_1d8);
  poVar1 = std::operator<<(poVar1," but was ");
  utility::ToString<unsigned_long>(local_1f8,local_20);
  std::operator<<(poVar1,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected " << utility::ToString(m_expected) << " but was " << utility::ToString(actual);
				return errorMessage.str();
			}